

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O1

pint p_test_case_pcryptohash_invalid_test(void)

{
  int iVar1;
  long in_RAX;
  long lVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  psize len;
  long local_28;
  
  p_test_module_fail_counter = 0;
  local_28 = in_RAX;
  p_libsys_init();
  lVar2 = p_crypto_hash_new(0xffffffff);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xd0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_crypto_hash_get_length(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xd1);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_crypto_hash_get_string(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xd2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_crypto_hash_get_type(0);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xd3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_crypto_hash_free(0);
  p_crypto_hash_update(0,0,0);
  p_crypto_hash_get_digest(0,0,0);
  p_crypto_hash_get_digest(0,0,&local_28);
  if (local_28 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xda);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_crypto_hash_reset(0);
  lVar2 = p_crypto_hash_new(0);
  if (lVar2 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xdf);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar3 = p_crypto_hash_get_length(lVar2);
  if (lVar3 < 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xe2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_malloc0(lVar3);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xe5);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_crypto_hash_get_digest(lVar2,lVar4,&local_28);
  if (local_28 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xe8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_crypto_hash_update(lVar2,"abc",3);
  local_28 = lVar3 + -1;
  p_crypto_hash_get_digest(lVar2,lVar4,&local_28);
  if (local_28 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xed);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pcVar5 = (char *)p_crypto_hash_get_string(lVar2);
  iVar1 = strcmp(pcVar5,"900150983cd24fb0d6963f7d28e17f72");
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xf0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar5);
  p_crypto_hash_update(lVar2,"abc",3);
  pcVar5 = (char *)p_crypto_hash_get_string(lVar2);
  iVar1 = strcmp(pcVar5,"900150983cd24fb0d6963f7d28e17f72");
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pcryptohash_test.cpp"
           ,0xf5);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar5);
  p_crypto_hash_free(lVar2);
  p_free(lVar4);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (pcryptohash_invalid_test)
{
	PCryptoHash	*hash;
	psize		len;
	pssize		md5_len;
	pchar		*hash_str;
	puchar		*buf;

	p_libsys_init ();

	P_TEST_CHECK (p_crypto_hash_new ((PCryptoHashType) -1) == NULL);
	P_TEST_CHECK (p_crypto_hash_get_length (NULL) == 0);
	P_TEST_CHECK (p_crypto_hash_get_string (NULL) == NULL);
	P_TEST_CHECK ((pint) p_crypto_hash_get_type (NULL) == -1);
	p_crypto_hash_free (NULL);

	p_crypto_hash_update (NULL, NULL, 0);
	p_crypto_hash_get_digest (NULL, NULL, NULL);

	p_crypto_hash_get_digest (NULL, NULL, &len);
	P_TEST_CHECK (len == 0);

	p_crypto_hash_reset (NULL);

	hash = p_crypto_hash_new (P_CRYPTO_HASH_TYPE_MD5);
	P_TEST_CHECK (hash != NULL);

	md5_len = p_crypto_hash_get_length (hash);
	P_TEST_CHECK (md5_len > 0);

	buf = (puchar *) p_malloc0 (md5_len);
	P_TEST_CHECK (buf != NULL);

	p_crypto_hash_get_digest (hash, buf, &len);
	P_TEST_CHECK (len == 0);

	p_crypto_hash_update (hash, (const puchar *) ("abc"), 3);
	len = ((psize) md5_len) - 1;
	p_crypto_hash_get_digest (hash, buf, &len);
	P_TEST_CHECK (len == 0);

	hash_str = p_crypto_hash_get_string (hash);
	P_TEST_CHECK (strcmp (hash_str, "900150983cd24fb0d6963f7d28e17f72") == 0);
	p_free (hash_str);

	p_crypto_hash_update (hash, (const puchar *) ("abc"), 3);
	hash_str = p_crypto_hash_get_string (hash);
	P_TEST_CHECK (strcmp (hash_str, "900150983cd24fb0d6963f7d28e17f72") == 0);
	p_free (hash_str);

	p_crypto_hash_free (hash);
	p_free (buf);

	p_libsys_shutdown ();
}